

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

void chrono::utils::AddConeGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double height,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [8];
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ChConeShape *this;
  ChBody *model;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  double dVar11;
  element_type *peVar12;
  shared_ptr<chrono::ChConeShape> cone;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_200 [2];
  double local_1f0;
  undefined1 local_1e8 [24];
  undefined1 auStack_1d0 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  element_type *local_1b8;
  ChSystem *pCStack_1b0;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  pointer local_198;
  pointer local_190;
  ChVisualModel *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  double local_178;
  _func_int **pp_Stack_170;
  double local_168;
  double local_158;
  double dStack_150;
  undefined1 local_140 [8];
  undefined1 local_138 [16];
  element_type *peStack_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  ChMatrix33<double> local_100;
  ChFrame<double> local_b8;
  
  dStack_120 = (double)local_138._0_8_;
  local_140 = (undefined1  [8])0x3ff0000000000000;
  local_138 = ZEXT816(0);
  peStack_128 = (element_type *)0x0;
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[0] = 1.0;
  local_b8.coord.rot.m_data[1] = 0.0;
  local_b8.coord.rot.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[3] = 0.0;
  local_1f0 = radius;
  local_198 = (pointer)vis_material;
  local_190 = (pointer)material;
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,(ChQuaternion<double> *)local_140);
  local_140 = (undefined1  [8])&PTR__ChFrame_00b03780;
  local_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__ChFrame_00b03780;
  dVar11 = pos->m_data[2];
  auVar7._8_8_ = dVar11;
  auVar7._0_8_ = dVar11;
  auVar7._16_8_ = dVar11;
  auVar7._24_8_ = dVar11;
  auVar7 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])pos->m_data),auVar7,0x30);
  dVar11 = rot->m_data[0];
  auVar9._8_8_ = dVar11;
  auVar9._0_8_ = dVar11;
  auVar9._16_8_ = dVar11;
  auVar9._24_8_ = dVar11;
  _local_138 = vblendps_avx(auVar7,auVar9,0xc0);
  local_118 = rot->m_data[1];
  dStack_110 = rot->m_data[2];
  local_108 = rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_100,rot);
  local_b8.coord.pos.m_data[0] = (double)local_138._0_8_;
  local_b8.coord.pos.m_data[1] = (double)local_138._8_8_;
  local_b8.coord.pos.m_data[2] = (double)peStack_128;
  local_b8.coord.rot.m_data[0] = dStack_120;
  local_b8.coord.rot.m_data[1] = local_118;
  local_b8.coord.rot.m_data[2] = dStack_110;
  local_b8.coord.rot.m_data[3] = local_108;
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  peVar12 = peStack_128;
  local_178 = (double)local_138._0_8_;
  dVar11 = (double)local_138._8_8_;
  if (body != (ChBody *)0x0) {
    local_158 = (double)local_138._0_8_;
    dStack_150 = (double)local_138._8_8_;
    local_1a8 = peStack_128;
    lVar4 = __dynamic_cast(body,&ChBody::typeinfo,&ChBodyAuxRef::typeinfo,0);
    peVar12 = local_1a8;
    local_178 = local_158;
    dVar11 = dStack_150;
    if (lVar4 != 0) {
      ChFrame<double>::operator>>
                ((ChFrame<double> *)local_140,&local_b8,(ChFrame<double> *)(lVar4 + 0x360));
      local_b8.coord.pos.m_data[0] = (double)local_138._0_8_;
      local_b8.coord.pos.m_data[1] = (double)local_138._8_8_;
      local_b8.coord.pos.m_data[2] = (double)peStack_128;
      local_b8.coord.rot.m_data[0] = dStack_120;
      local_b8.coord.rot.m_data[1] = local_118;
      local_b8.coord.rot.m_data[2] = dStack_110;
      local_b8.coord.rot.m_data[3] = local_108;
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_100.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      peVar12 = peStack_128;
      local_178 = (double)local_138._0_8_;
      dVar11 = (double)local_138._8_8_;
    }
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = height * 0.25;
  auVar6 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar6);
  local_178 = auVar6._0_8_ + local_178;
  pp_Stack_170 = (_func_int **)(auVar6._8_8_ + dVar11);
  local_168 = (double)peVar12 + 0.0;
  peVar1 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  local_1b8 = (local_190->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCStack_1b0 = (ChSystem *)
                (local_190->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  p_Var2 = (local_190->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_140,rot);
  (*peVar1->_vptr_ChCollisionModel[10])
            (local_1f0,local_1f0,height,peVar1,&local_1b8,&local_178,local_140);
  if (pCStack_1b0 != (ChSystem *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_1b0);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    auVar3 = local_140;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_);
    }
    if (auVar3 == (undefined1  [8])0x0) {
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      local_1e8._0_8_ = p_Var5 + 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = 2;
      }
      model = (ChBody *)local_1e8;
      local_1e8._8_8_ = p_Var5;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    this = (ChConeShape *)ChVisualShape::operator_new((ChVisualShape *)0x60,(size_t)model);
    ChConeShape::ChConeShape(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChConeShape*>
              (a_Stack_200,this);
    (this->gcone).rad.m_data[0] = local_1f0;
    (this->gcone).rad.m_data[1] = height;
    (this->gcone).rad.m_data[2] = local_1f0;
    auStack_1d0._8_8_ =
         ((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
         &local_198->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)->_M_ptr;
    p_Stack_1c0 = (((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_198->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)->
                  _M_refcount)._M_pi;
    p_Var5 = (((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
              &local_198->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)->
             _M_refcount)._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial
              ((ChVisualShape *)this,(shared_ptr<chrono::ChVisualMaterial> *)(auStack_1d0 + 8));
    if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    auStack_1d0._0_8_ = a_Stack_200[0]._M_pi;
    if (a_Stack_200[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (a_Stack_200[0]._M_pi)->_M_use_count = (a_Stack_200[0]._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (a_Stack_200[0]._M_pi)->_M_use_count = (a_Stack_200[0]._M_pi)->_M_use_count + 1;
      }
    }
    auVar8._8_8_ = local_168;
    auVar8._0_8_ = local_168;
    auVar8._16_8_ = local_168;
    auVar8._24_8_ = local_168;
    local_140 = (undefined1  [8])local_1a0._M_pi;
    auVar7 = vblendpd_avx(ZEXT1632(CONCAT88(pp_Stack_170,local_178)),auVar8,4);
    dVar11 = rot->m_data[0];
    auVar10._8_8_ = dVar11;
    auVar10._0_8_ = dVar11;
    auVar10._16_8_ = dVar11;
    auVar10._24_8_ = dVar11;
    _local_138 = vblendpd_avx(auVar7,auVar10,8);
    local_118 = rot->m_data[1];
    dStack_110 = rot->m_data[2];
    local_108 = rot->m_data[3];
    local_1e8._16_8_ = this;
    ChMatrix33<double>::ChMatrix33(&local_100,rot);
    ChVisualModel::AddShape
              (local_188,(shared_ptr<chrono::ChVisualShape> *)(local_1e8 + 0x10),
               (ChFrame<double> *)local_140);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1d0._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1d0._0_8_);
    }
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
    }
    if (a_Stack_200[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_200[0]._M_pi);
    }
  }
  return;
}

Assistant:

void AddConeGeometry(ChBody* body,
                     std::shared_ptr<ChMaterialSurface> material,
                     double radius,
                     double height,
                     const ChVector<>& pos,
                     const ChQuaternion<>& rot,
                     bool visualization,
                     std::shared_ptr<ChVisualMaterial> vis_material) {
    ChFrame<> frame;
    frame = ChFrame<>(pos, rot);
    if (ChBodyAuxRef* body_ar = dynamic_cast<ChBodyAuxRef*>(body)) {
        frame = frame >> body_ar->GetFrame_REF_to_COG();
    }
    ChVector<> pos_shifted = frame.GetPos() + ChVector<>(0, 0.25 * height, 0);

    body->GetCollisionModel()->AddCone(material, radius, radius, height, pos_shifted, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto cone = chrono_types::make_shared<ChConeShape>();
        cone->GetConeGeometry().rad = ChVector<>(radius, height, radius);
        cone->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(cone, ChFrame<>(pos_shifted, rot));
    }
}